

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O0

bool duckdb::ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
               (string_t *value,long *begin,long *end)

{
  long lVar1;
  string_t *value_00;
  int64_t length_00;
  long lVar2;
  long *in_RDX;
  long *in_RSI;
  string_t *in_RDI;
  int64_t length;
  bool is_min;
  
  if (*in_RSI != 0) {
    lVar2 = *in_RSI;
    lVar1 = NumericLimits<long>::Minimum();
    if (lVar2 != lVar1) {
      value_00 = (string_t *)(*in_RSI + -1);
      goto LAB_0203ebcd;
    }
  }
  value_00 = (string_t *)*in_RSI;
LAB_0203ebcd:
  *in_RSI = (long)value_00;
  lVar2 = *in_RSI;
  lVar1 = NumericLimits<long>::Minimum();
  if (lVar2 == lVar1) {
    *in_RSI = *in_RSI + 1;
  }
  length_00 = StringSliceOperations::ValueLength(value_00);
  if ((((*in_RSI < 0) && (length_00 < -*in_RSI)) && (*in_RDX < 0)) && (*in_RDX < -length_00)) {
    *in_RSI = 0;
    *in_RDX = 0;
  }
  else {
    if ((*in_RSI < 0) && (length_00 < -*in_RSI)) {
      *in_RSI = 0;
    }
    ClampIndex<duckdb::string_t,long>(in_RSI,in_RDI,length_00,lVar2 == lVar1);
    ClampIndex<duckdb::string_t,long>(in_RDX,in_RDI,length_00,false);
    lVar2 = MaxValue<long>(*in_RSI,*in_RDX);
    *in_RDX = lVar2;
  }
  return true;
}

Assistant:

static bool ClampSlice(const INPUT_TYPE &value, INDEX_TYPE &begin, INDEX_TYPE &end) {
	// Clamp offsets
	begin = (begin != 0 && begin != (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) ? begin - 1 : begin;

	bool is_min = false;
	if (begin == (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) {
		begin++;
		is_min = true;
	}

	const auto length = OP::ValueLength(value);
	if (begin < 0 && -begin > length && end < 0 && end < -length) {
		begin = 0;
		end = 0;
		return true;
	}
	if (begin < 0 && -begin > length) {
		begin = 0;
	}
	ClampIndex(begin, value, length, is_min);
	ClampIndex(end, value, length, false);
	end = MaxValue<INDEX_TYPE>(begin, end);

	return true;
}